

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,_Bool *login_changed,
                   _Bool *password_changed,char *netrcfile)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  char local_498 [8];
  char pwbuf [1024];
  passwd *pw_res;
  passwd pw;
  char *homea;
  char *home;
  char *filealloc;
  int retcode;
  char *netrcfile_local;
  _Bool *password_changed_local;
  _Bool *login_changed_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  
  if (netrcfile == (char *)0x0) {
    homea = (char *)0x0;
    pw.pw_shell = curl_getenv("HOME");
    pcVar2 = pw.pw_shell;
    if (pw.pw_shell == (char *)0x0) {
      __uid = geteuid();
      iVar1 = getpwuid_r(__uid,(passwd *)&pw_res,local_498,0x400,(passwd **)(pwbuf + 0x3f8));
      pcVar2 = homea;
      if ((iVar1 == 0) && (pwbuf._1016_8_ != 0)) {
        homea = pw.pw_gecos;
        pcVar2 = homea;
      }
    }
    homea = pcVar2;
    if (homea == (char *)0x0) {
      return 1;
    }
    pcVar2 = curl_maprintf("%s%s.netrc",homea,"/");
    if (pcVar2 == (char *)0x0) {
      (*Curl_cfree)(pw.pw_shell);
      return -1;
    }
    filealloc._4_4_ = parsenetrc(host,loginp,passwordp,login_changed,password_changed,pcVar2);
    (*Curl_cfree)(pcVar2);
    (*Curl_cfree)(pw.pw_shell);
  }
  else {
    filealloc._4_4_ = parsenetrc(host,loginp,passwordp,login_changed,password_changed,netrcfile);
  }
  return filealloc._4_4_;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    bool *login_changed,
                    bool *password_changed,
                    char *netrcfile)
{
  int retcode = 1;
  char *filealloc = NULL;

  if(!netrcfile) {
    char *home = NULL;
    char *homea = curl_getenv("HOME"); /* portable environment reader */
    if(homea) {
      home = homea;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = pw.pw_dir;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of
                         memory) */

    filealloc = curl_maprintf("%s%s.netrc", home, DIR_CHAR);
    if(!filealloc) {
      free(homea);
      return -1;
    }
    retcode = parsenetrc(host, loginp, passwordp, login_changed,
                         password_changed, filealloc);
    free(filealloc);
#ifdef WIN32
    if(retcode == NETRC_FILE_MISSING) {
      /* fallback to the old-style "_netrc" file */
      filealloc = curl_maprintf("%s%s_netrc", home, DIR_CHAR);
      if(!filealloc) {
        free(homea);
        return -1;
      }
      retcode = parsenetrc(host, loginp, passwordp, login_changed,
                           password_changed, filealloc);
      free(filealloc);
    }
#endif
    free(homea);
  }
  else
    retcode = parsenetrc(host, loginp, passwordp, login_changed,
                         password_changed, netrcfile);
  return retcode;
}